

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O1

void skiwi::format_test_8(void)

{
  string res;
  format_options ops;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  format_options local_24 [4];
  undefined4 local_20;
  
  skiwi::format_options::format_options(local_24);
  local_20 = 10;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,
             "(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ",
             "");
  skiwi::format((string *)local_48,(format_options *)local_a8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_88,(EVP_PKEY_CTX *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "\n(let ([f (lambda\n           (a0 a1 . args)\n           (vector a0 a1))])\n     (f 10 20 30 40 50 60 70 80 90 100))\n"
             ,"");
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_68,(EVP_PKEY_CTX *)local_c8);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_88,local_80 + (long)local_88);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_68,&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x114,"void skiwi::format_test_8()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void format_test_8()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ", ops));
  TEST_EQ(cleanup(R"(
(let ([f (lambda
           (a0 a1 . args)
           (vector a0 a1))])
     (f 10 20 30 40 50 60 70 80 90 100))
)"), res);
  }